

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaParser::ExtractDataObjectFromChannel
          (ColladaParser *this,InputChannel *pInput,size_t pLocalIndex,Mesh *pMesh)

{
  float fVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  Accessor *pAVar5;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar6;
  basic_formatter *this_00;
  const_reference pvVar7;
  string *psVar8;
  size_type sVar9;
  size_type sVar10;
  Logger *pLVar11;
  float *pfVar12;
  ulong local_330;
  size_t i;
  aiColor4D result;
  aiColor4t<float> local_310;
  __normal_iterator<aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
  local_300;
  const_iterator local_2f8;
  aiVector3t<float> local_2ec;
  aiVector3t<float> *local_2e0;
  aiVector3t<float> local_2d4;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_2c8;
  const_iterator local_2c0;
  aiVector3t<float> local_2b4;
  aiVector3t<float> *local_2a8;
  aiVector3t<float> local_29c;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_290;
  const_iterator local_288;
  aiVector3t<float> local_27c;
  aiVector3t<float> *local_270;
  aiVector3t<float> local_264;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_258;
  const_iterator local_250;
  aiVector3t<float> local_244;
  aiVector3t<float> *local_238;
  aiVector3t<float> local_22c;
  __normal_iterator<aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_220;
  const_iterator local_218;
  aiVector3t<float> local_20c;
  ulong local_200;
  size_t c;
  ai_real obj [4];
  ai_real *dataObject;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> local_1c8 [376];
  string local_50;
  Accessor *local_30;
  Accessor *acc;
  Mesh *pMesh_local;
  size_t pLocalIndex_local;
  InputChannel *pInput_local;
  ColladaParser *this_local;
  
  if (pInput->mType != IT_Vertex) {
    local_30 = pInput->mResolved;
    acc = (Accessor *)pMesh;
    pMesh_local = (Mesh *)pLocalIndex;
    pLocalIndex_local = (size_t)pInput;
    pInput_local = (InputChannel *)this;
    if (local_30->mCount <= pLocalIndex) {
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_1c8);
      pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(local_1c8,(char (*) [21])"Invalid data index (");
      pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar6,(unsigned_long *)&pMesh_local);
      pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar6,(char (*) [2])0xb59ae4);
      pbVar6 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator<<(pbVar6,&local_30->mCount);
      this_00 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator<<(pbVar6,(char (*) [29])") in primitive specification");
      Formatter::basic_formatter::operator_cast_to_string(&local_50,this_00);
      ThrowException(this,&local_50);
    }
    pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](&local_30->mData->mValues,0);
    sVar2 = local_30->mOffset;
    sVar3 = local_30->mStride;
    for (local_200 = 0; local_200 < 4; local_200 = local_200 + 1) {
      obj[local_200 - 2] =
           pvVar7[sVar2 + (long)pMesh_local * sVar3 + local_30->mSubOffset[local_200]];
    }
    switch(*(undefined4 *)pLocalIndex_local) {
    case 2:
      if (*(long *)(pLocalIndex_local + 8) == 0) {
        psVar8 = &acc->mSource;
        aiVector3t<float>::aiVector3t(&local_20c,(float)c,c._4_4_,obj[0]);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)psVar8,
                   &local_20c);
      }
      else {
        pLVar11 = DefaultLogger::get();
        Logger::error(pLVar11,"Collada: just one vertex position stream supported");
      }
      break;
    case 3:
      sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         ((long)&(acc->mSource).field_2 + 8));
      sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          &acc->mSource);
      if (sVar9 < sVar10 - 1) {
        psVar8 = &acc->mSource;
        local_220._M_current =
             (aiVector3t<float> *)
             std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        ((long)&(acc->mSource).field_2 + 8));
        __gnu_cxx::
        __normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
        ::__normal_iterator<aiVector3t<float>*>
                  ((__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
                    *)&local_218,&local_220);
        sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           &acc->mSource);
        sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            ((long)&(acc->mSource).field_2 + 8));
        aiVector3t<float>::aiVector3t(&local_22c,0.0,1.0,0.0);
        local_238 = (aiVector3t<float> *)
                    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::insert
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               ((long)&psVar8->field_2 + 8),local_218,(sVar9 - sVar10) - 1,
                               &local_22c);
      }
      if (*(long *)(pLocalIndex_local + 8) == 0) {
        psVar8 = &acc->mSource;
        aiVector3t<float>::aiVector3t(&local_244,(float)c,c._4_4_,obj[0]);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   ((long)&psVar8->field_2 + 8),&local_244);
      }
      else {
        pLVar11 = DefaultLogger::get();
        Logger::error(pLVar11,"Collada: just one vertex normal stream supported");
      }
      break;
    case 4:
      if (*(ulong *)(pLocalIndex_local + 8) < 8) {
        sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           (acc[1].mSubOffset + *(long *)(pLocalIndex_local + 8) * 3));
        sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &acc->mSource);
        if (sVar9 < sVar10 - 1) {
          lVar4 = *(long *)(pLocalIndex_local + 8);
          pAVar5 = acc + 1;
          local_2c8._M_current =
               (aiVector3t<float> *)
               std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          (acc[1].mSubOffset + *(long *)(pLocalIndex_local + 8) * 3));
          __gnu_cxx::
          __normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
          ::__normal_iterator<aiVector3t<float>*>
                    ((__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
                      *)&local_2c0,&local_2c8);
          sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &acc->mSource);
          sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                             ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                              (acc[1].mSubOffset + *(long *)(pLocalIndex_local + 8) * 3));
          aiVector3t<float>::aiVector3t(&local_2d4,0.0,0.0,0.0);
          local_2e0 = (aiVector3t<float> *)
                      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::insert
                                ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                                 (pAVar5->mSubOffset + lVar4 * 3),local_2c0,(sVar9 - sVar10) - 1,
                                 &local_2d4);
        }
        lVar4 = *(long *)(pLocalIndex_local + 8);
        pAVar5 = acc + 1;
        aiVector3t<float>::aiVector3t(&local_2ec,(float)c,c._4_4_,obj[0]);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   (pAVar5->mSubOffset + lVar4 * 3),&local_2ec);
        if ((local_30->mSubOffset[2] != 0) || (local_30->mSubOffset[3] != 0)) {
          *(undefined4 *)((long)acc[4].mSubOffset + *(long *)(pLocalIndex_local + 8) * 4) = 3;
        }
      }
      else {
        pLVar11 = DefaultLogger::get();
        Logger::error(pLVar11,"Collada: too many texture coordinate sets. Skipping.");
      }
      break;
    case 5:
      if (*(ulong *)(pLocalIndex_local + 8) < 8) {
        sVar9 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                          ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                           (acc[2].mSubOffset + *(long *)(pLocalIndex_local + 8) * 3 + 8));
        sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &acc->mSource);
        if (sVar9 < sVar10 - 1) {
          lVar4 = *(long *)(pLocalIndex_local + 8);
          pAVar5 = acc + 2;
          local_300._M_current =
               (aiColor4t<float> *)
               std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::end
                         ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                          (acc[2].mSubOffset + *(long *)(pLocalIndex_local + 8) * 3 + 8));
          __gnu_cxx::
          __normal_iterator<aiColor4t<float>const*,std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>>
          ::__normal_iterator<aiColor4t<float>*>
                    ((__normal_iterator<aiColor4t<float>const*,std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>>
                      *)&local_2f8,&local_300);
          sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                             &acc->mSource);
          sVar10 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                             ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                              (acc[2].mSubOffset + *(long *)(pLocalIndex_local + 8) * 3 + 8));
          aiColor4t<float>::aiColor4t(&local_310,0.0,0.0,0.0,1.0);
          result._8_8_ = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::insert
                                   ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                                    (pAVar5->mSubOffset + lVar4 * 3 + 8),local_2f8,
                                    (sVar9 - sVar10) - 1,&local_310);
        }
        aiColor4t<float>::aiColor4t((aiColor4t<float> *)&i,0.0,0.0,0.0,1.0);
        for (local_330 = 0; local_330 < *(ulong *)(*(long *)(pLocalIndex_local + 0x38) + 8);
            local_330 = local_330 + 1) {
          fVar1 = obj[*(long *)(*(long *)(pLocalIndex_local + 0x38) + 0x38 + local_330 * 8) + -2];
          pfVar12 = aiColor4t<float>::operator[]((aiColor4t<float> *)&i,(uint)local_330);
          *pfVar12 = fVar1;
        }
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                  ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)
                   (acc[2].mSubOffset + *(long *)(pLocalIndex_local + 8) * 3 + 8),(value_type *)&i);
      }
      else {
        pLVar11 = DefaultLogger::get();
        Logger::error(pLVar11,"Collada: too many vertex color sets. Skipping.");
      }
      break;
    case 6:
      sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &acc[1].mSize);
      sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          &acc->mSource);
      if (sVar9 < sVar10 - 1) {
        pAVar5 = acc + 1;
        local_258._M_current =
             (aiVector3t<float> *)
             std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &acc[1].mSize);
        __gnu_cxx::
        __normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
        ::__normal_iterator<aiVector3t<float>*>
                  ((__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
                    *)&local_250,&local_258);
        sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           &acc->mSource);
        sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &acc[1].mSize);
        aiVector3t<float>::aiVector3t(&local_264,1.0,0.0,0.0);
        local_270 = (aiVector3t<float> *)
                    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::insert
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               &pAVar5->mSize,local_250,(sVar9 - sVar10) - 1,&local_264);
      }
      if (*(long *)(pLocalIndex_local + 8) == 0) {
        pAVar5 = acc + 1;
        aiVector3t<float>::aiVector3t(&local_27c,(float)c,c._4_4_,obj[0]);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)&pAVar5->mSize,
                   &local_27c);
      }
      else {
        pLVar11 = DefaultLogger::get();
        Logger::error(pLVar11,"Collada: just one vertex tangent stream supported");
      }
      break;
    case 7:
      sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                        ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                         &acc[1].mParams);
      sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                         ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                          &acc->mSource);
      if (sVar9 < sVar10 - 1) {
        pAVar5 = acc + 1;
        local_290._M_current =
             (aiVector3t<float> *)
             std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::end
                       ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                        &acc[1].mParams);
        __gnu_cxx::
        __normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
        ::__normal_iterator<aiVector3t<float>*>
                  ((__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>
                    *)&local_288,&local_290);
        sVar9 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                          ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                           &acc->mSource);
        sVar10 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            &acc[1].mParams);
        aiVector3t<float>::aiVector3t(&local_29c,0.0,0.0,1.0);
        local_2a8 = (aiVector3t<float> *)
                    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::insert
                              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                               &pAVar5->mParams,local_288,(sVar9 - sVar10) - 1,&local_29c);
      }
      if (*(long *)(pLocalIndex_local + 8) == 0) {
        pAVar5 = acc + 1;
        aiVector3t<float>::aiVector3t(&local_2b4,(float)c,c._4_4_,obj[0]);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                  ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                   &pAVar5->mParams,&local_2b4);
      }
      else {
        pLVar11 = DefaultLogger::get();
        Logger::error(pLVar11,"Collada: just one vertex bitangent stream supported");
      }
      break;
    default:
      __assert_fail("false && \"shouldn\'t ever get here\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.cpp"
                    ,0xae7,
                    "void Assimp::ColladaParser::ExtractDataObjectFromChannel(const InputChannel &, size_t, Mesh *)"
                   );
    }
  }
  return;
}

Assistant:

void ColladaParser::ExtractDataObjectFromChannel(const InputChannel& pInput, size_t pLocalIndex, Mesh* pMesh)
{
    // ignore vertex referrer - we handle them that separate
    if (pInput.mType == IT_Vertex)
        return;

    const Accessor& acc = *pInput.mResolved;
    if (pLocalIndex >= acc.mCount)
        ThrowException(format() << "Invalid data index (" << pLocalIndex << "/" << acc.mCount << ") in primitive specification");

    // get a pointer to the start of the data object referred to by the accessor and the local index
    const ai_real* dataObject = &(acc.mData->mValues[0]) + acc.mOffset + pLocalIndex * acc.mStride;

    // assemble according to the accessors component sub-offset list. We don't care, yet,
    // what kind of object exactly we're extracting here
    ai_real obj[4];
    for (size_t c = 0; c < 4; ++c)
        obj[c] = dataObject[acc.mSubOffset[c]];

    // now we reinterpret it according to the type we're reading here
    switch (pInput.mType)
    {
    case IT_Position: // ignore all position streams except 0 - there can be only one position
        if (pInput.mIndex == 0)
            pMesh->mPositions.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex position stream supported");
        break;
    case IT_Normal:
        // pad to current vertex count if necessary
        if (pMesh->mNormals.size() < pMesh->mPositions.size() - 1)
            pMesh->mNormals.insert(pMesh->mNormals.end(), pMesh->mPositions.size() - pMesh->mNormals.size() - 1, aiVector3D(0, 1, 0));

        // ignore all normal streams except 0 - there can be only one normal
        if (pInput.mIndex == 0)
            pMesh->mNormals.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex normal stream supported");
        break;
    case IT_Tangent:
        // pad to current vertex count if necessary
        if (pMesh->mTangents.size() < pMesh->mPositions.size() - 1)
            pMesh->mTangents.insert(pMesh->mTangents.end(), pMesh->mPositions.size() - pMesh->mTangents.size() - 1, aiVector3D(1, 0, 0));

        // ignore all tangent streams except 0 - there can be only one tangent
        if (pInput.mIndex == 0)
            pMesh->mTangents.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex tangent stream supported");
        break;
    case IT_Bitangent:
        // pad to current vertex count if necessary
        if (pMesh->mBitangents.size() < pMesh->mPositions.size() - 1)
            pMesh->mBitangents.insert(pMesh->mBitangents.end(), pMesh->mPositions.size() - pMesh->mBitangents.size() - 1, aiVector3D(0, 0, 1));

        // ignore all bitangent streams except 0 - there can be only one bitangent
        if (pInput.mIndex == 0)
            pMesh->mBitangents.push_back(aiVector3D(obj[0], obj[1], obj[2]));
        else
            ASSIMP_LOG_ERROR("Collada: just one vertex bitangent stream supported");
        break;
    case IT_Texcoord:
        // up to 4 texture coord sets are fine, ignore the others
        if (pInput.mIndex < AI_MAX_NUMBER_OF_TEXTURECOORDS)
        {
            // pad to current vertex count if necessary
            if (pMesh->mTexCoords[pInput.mIndex].size() < pMesh->mPositions.size() - 1)
                pMesh->mTexCoords[pInput.mIndex].insert(pMesh->mTexCoords[pInput.mIndex].end(),
                    pMesh->mPositions.size() - pMesh->mTexCoords[pInput.mIndex].size() - 1, aiVector3D(0, 0, 0));

            pMesh->mTexCoords[pInput.mIndex].push_back(aiVector3D(obj[0], obj[1], obj[2]));
            if (0 != acc.mSubOffset[2] || 0 != acc.mSubOffset[3]) /* hack ... consider cleaner solution */
                pMesh->mNumUVComponents[pInput.mIndex] = 3;
        }
        else
        {
            ASSIMP_LOG_ERROR("Collada: too many texture coordinate sets. Skipping.");
        }
        break;
    case IT_Color:
        // up to 4 color sets are fine, ignore the others
        if (pInput.mIndex < AI_MAX_NUMBER_OF_COLOR_SETS)
        {
            // pad to current vertex count if necessary
            if (pMesh->mColors[pInput.mIndex].size() < pMesh->mPositions.size() - 1)
                pMesh->mColors[pInput.mIndex].insert(pMesh->mColors[pInput.mIndex].end(),
                    pMesh->mPositions.size() - pMesh->mColors[pInput.mIndex].size() - 1, aiColor4D(0, 0, 0, 1));

            aiColor4D result(0, 0, 0, 1);
            for (size_t i = 0; i < pInput.mResolved->mSize; ++i)
            {
                result[static_cast<unsigned int>(i)] = obj[pInput.mResolved->mSubOffset[i]];
            }
            pMesh->mColors[pInput.mIndex].push_back(result);
        }
        else
        {
            ASSIMP_LOG_ERROR("Collada: too many vertex color sets. Skipping.");
        }

        break;
    default:
        // IT_Invalid and IT_Vertex
        ai_assert(false && "shouldn't ever get here");
    }
}